

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_yplus_metric_reference_length
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_DBL reference_length,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  bool bVar4;
  double dVar5;
  REF_EDGE ref_edge;
  uint uVar6;
  REF_STATUS RVar7;
  REF_BOOL RVar8;
  REF_INT *vector;
  long lVar9;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  REF_DICT ref_dict;
  undefined8 uVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  REF_DBL *pRVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  REF_INT bc;
  REF_DBL edg_norm [3];
  REF_DBL yplus1;
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  uint local_1fc;
  REF_DBL *local_1f8;
  REF_DBL *local_1e8;
  REF_INT local_1d4;
  REF_DBL *local_1d0;
  REF_GRID local_1c8;
  double local_1c0;
  REF_DICT local_1b8;
  REF_DBL local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  REF_DBL local_188;
  REF_DBL local_180;
  REF_DBL local_178;
  double local_170;
  double local_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  local_1b8 = ref_dict_bcs;
  local_1b0 = target;
  local_188 = reference_length;
  local_180 = mach;
  local_178 = re;
  local_1fc = ref_phys_minspac(re * reference_length,&local_170);
  if (local_1fc != 0) {
    pcVar15 = "minspac";
    uVar11 = 0x4a6;
    uVar14 = 1;
    goto LAB_001b2f20;
  }
  local_1c0 = local_170;
  local_1d0 = metric;
  local_1c8 = ref_grid;
  if ((long)ref_node->max < 0) {
    local_1fc = 1;
    pcVar15 = "malloc hits of REF_INT negative";
LAB_001b2fa1:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4a9,
           "ref_phys_yplus_metric_reference_length",pcVar15);
    vector = (REF_INT *)0x0;
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node->max << 2);
    if (vector == (REF_INT *)0x0) {
      local_1fc = 2;
      pcVar15 = "malloc hits of REF_INT NULL";
      goto LAB_001b2fa1;
    }
    bVar4 = true;
    local_1fc = 0;
    if (0 < ref_node->max) {
      lVar12 = 0;
      do {
        vector[lVar12] = 0;
        lVar12 = lVar12 + 1;
      } while (lVar12 < ref_node->max);
    }
  }
  if (!bVar4) {
    return local_1fc;
  }
  uVar6 = ref_node->max;
  if ((int)uVar6 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4aa,
           "ref_phys_yplus_metric_reference_length","malloc new_log_metric of REF_DBL negative");
    local_1fc = 1;
  }
  else {
    local_1f8 = (REF_DBL *)malloc((ulong)uVar6 * 0x30);
    if (local_1f8 == (REF_DBL *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4aa,
             "ref_phys_yplus_metric_reference_length","malloc new_log_metric of REF_DBL NULL");
      local_1fc = 2;
      local_1f8 = (REF_DBL *)0x0;
    }
    else {
      bVar4 = true;
      if ((ulong)uVar6 != 0) {
        uVar13 = 1;
        if (1 < (int)(uVar6 * 6)) {
          uVar13 = (ulong)(uVar6 * 6);
        }
        memset(local_1f8,0,uVar13 << 3);
      }
    }
  }
  if (!bVar4) {
    return local_1fc;
  }
  iVar17 = ref_node->max;
  if ((long)iVar17 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4ab,
           "ref_phys_yplus_metric_reference_length","malloc lengthscale of REF_DBL negative");
    local_1fc = 1;
LAB_001b3157:
    bVar4 = false;
  }
  else {
    __size = (long)iVar17 * 8;
    local_1e8 = (REF_DBL *)malloc(__size);
    if (local_1e8 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4ab,
             "ref_phys_yplus_metric_reference_length","malloc lengthscale of REF_DBL NULL");
      local_1fc = 2;
      local_1e8 = (REF_DBL *)0x0;
      goto LAB_001b3157;
    }
    bVar4 = true;
    if (iVar17 != 0) {
      memset(local_1e8,0,__size);
    }
  }
  if (!bVar4) {
    return local_1fc;
  }
  uVar6 = ref_phys_yplus_lengthscale(local_1c8,local_180,local_178,temperature,ldim,field,local_1e8)
  ;
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4ae,
           "ref_phys_yplus_metric_reference_length",(ulong)uVar6,"length scale");
    return uVar6;
  }
  if (local_1c8->twod != 0) {
    ref_cell = local_1c8->cell[0];
    bVar4 = 0 < ref_cell->max;
    if (0 < ref_cell->max) {
      local_1c0 = local_1c0 / local_188;
      iVar17 = 0;
      ref_dict = local_1b8;
      do {
        RVar7 = ref_cell_nodes(ref_cell,iVar17,(REF_INT *)&local_108);
        if (RVar7 == 0) {
          local_1d4 = -1;
          uVar6 = ref_dict_value(ref_dict,*(REF_INT *)
                                           ((long)&local_108 + (long)ref_cell->node_per * 4),
                                 &local_1d4);
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x4b9,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"bc");
            local_1fc = uVar6;
          }
          if ((uVar6 != 5) && (uVar6 != 0)) break;
          RVar8 = ref_phys_wall_distance_bc(local_1d4);
          ref_dict = local_1b8;
          if (RVar8 != 0) {
            uVar6 = ref_layer_interior_seg_normal(local_1c8,iVar17,&local_1a8);
            pRVar10 = local_1d0;
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x4bb,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"edge norm");
              local_1fc = uVar6;
              break;
            }
            local_150 = local_1a8;
            local_148 = local_1a0;
            local_140 = local_198;
            lVar12 = (long)(int)local_108;
            dVar21 = (local_1d0[lVar12 * 6 + 5] * local_198 +
                     local_1d0[lVar12 * 6 + 2] * local_1a8 + local_1a0 * local_1d0[lVar12 * 6 + 4])
                     * local_198 +
                     (local_1d0[lVar12 * 6 + 2] * local_198 +
                     local_1d0[lVar12 * 6] * local_1a8 + local_1a0 * local_1d0[lVar12 * 6 + 1]) *
                     local_1a8 +
                     (local_1d0[lVar12 * 6 + 4] * local_198 +
                     local_1d0[lVar12 * 6 + 1] * local_1a8 + local_1d0[lVar12 * 6 + 3] * local_1a0)
                     * local_1a0;
            if (dVar21 < 0.0) {
              dVar21 = sqrt(dVar21);
            }
            else {
              dVar21 = SQRT(dVar21);
            }
            lVar12 = (long)local_108._4_4_;
            dVar5 = (pRVar10[lVar12 * 6 + 5] * local_198 +
                    pRVar10[lVar12 * 6 + 2] * local_1a8 + local_1a0 * pRVar10[lVar12 * 6 + 4]) *
                    local_198 +
                    (pRVar10[lVar12 * 6 + 2] * local_198 +
                    pRVar10[lVar12 * 6] * local_1a8 + pRVar10[lVar12 * 6 + 1] * local_1a0) *
                    local_1a8 +
                    (pRVar10[lVar12 * 6 + 4] * local_198 +
                    pRVar10[lVar12 * 6 + 1] * local_1a8 + pRVar10[lVar12 * 6 + 3] * local_1a0) *
                    local_1a0;
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
            lVar12 = (long)(int)local_108;
            dVar20 = (local_1e8[lVar12] + local_1e8[local_108._4_4_]) * 0.5;
            dVar19 = dVar20 - local_1c0;
            if (dVar19 <= -dVar19) {
              dVar19 = -dVar19;
            }
            if (local_1c0 <= dVar20) {
              dVar20 = local_1c0;
            }
            dVar19 = dVar19 / local_1c0 + -0.1;
            if (dVar19 <= 0.0) {
              dVar19 = 0.0;
            }
            dVar19 = dVar19 / 0.1;
            if (1.0 <= dVar19) {
              dVar19 = 1.0;
            }
            dVar21 = dVar19 * (1.0 / ((dVar21 + dVar5) * 0.5)) +
                     (1.0 - dVar19) * ((dVar20 * local_1b0) / 0.866025403784439);
            local_168 = 1.0 / (dVar21 * dVar21);
            local_120 = 0;
            uStack_118 = 0;
            local_110 = 0x3ff0000000000000;
            local_158 = 0x3ff0000000000000;
            local_130 = local_150 - local_140 * 0.0;
            local_138 = local_140 * 0.0 - local_148;
            local_128 = local_148 * 0.0 + local_150 * -0.0;
            dVar21 = (pRVar10[lVar12 * 6 + 5] * local_128 +
                     local_138 * pRVar10[lVar12 * 6 + 2] + local_130 * pRVar10[lVar12 * 6 + 4]) *
                     local_128 +
                     (pRVar10[lVar12 * 6 + 2] * local_128 +
                     pRVar10[lVar12 * 6] * local_138 + local_130 * pRVar10[lVar12 * 6 + 1]) *
                     local_138 +
                     (pRVar10[lVar12 * 6 + 4] * local_128 +
                     pRVar10[lVar12 * 6 + 1] * local_138 + pRVar10[lVar12 * 6 + 3] * local_130) *
                     local_130;
            if (dVar21 < 0.0) {
              dVar21 = sqrt(dVar21);
            }
            else {
              dVar21 = SQRT(dVar21);
            }
            lVar12 = (long)local_108._4_4_;
            dVar5 = (pRVar10[lVar12 * 6 + 5] * local_128 +
                    pRVar10[lVar12 * 6 + 2] * local_138 + local_130 * pRVar10[lVar12 * 6 + 4]) *
                    local_128 +
                    (pRVar10[lVar12 * 6 + 2] * local_128 +
                    pRVar10[lVar12 * 6] * local_138 + pRVar10[lVar12 * 6 + 1] * local_130) *
                    local_138 +
                    (pRVar10[lVar12 * 6 + 4] * local_128 +
                    pRVar10[lVar12 * 6 + 1] * local_138 + pRVar10[lVar12 * 6 + 3] * local_130) *
                    local_130;
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
            dVar21 = 1.0 / ((dVar21 + dVar5) * 0.5);
            local_160 = 1.0 / (dVar21 * dVar21);
            uVar6 = ref_matrix_form_m(&local_168,local_68);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x4e3,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"form");
              local_1fc = uVar6;
              break;
            }
            uVar6 = ref_matrix_log_m(local_68,local_98);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x4e4,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"form");
              local_1fc = uVar6;
              break;
            }
            lVar12 = 0;
            do {
              local_1f8[(long)(int)local_108 * 6 + lVar12] =
                   local_98[lVar12] + local_1f8[(long)(int)local_108 * 6 + lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            vector[(int)local_108] = vector[(int)local_108] + 1;
            lVar12 = 0;
            do {
              local_1f8[(long)local_108._4_4_ * 6 + lVar12] =
                   local_98[lVar12] + local_1f8[(long)local_108._4_4_ * 6 + lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            vector[local_108._4_4_] = vector[local_108._4_4_] + 1;
            ref_dict = local_1b8;
          }
        }
        iVar17 = iVar17 + 1;
        bVar4 = iVar17 < ref_cell->max;
      } while (iVar17 < ref_cell->max);
    }
    if (bVar4) {
      return local_1fc;
    }
    uVar6 = ref_node_ghost_dbl(ref_node,local_1f8,6);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4f2,
             "ref_phys_yplus_metric_reference_length",(ulong)uVar6,"ghost metric");
      return uVar6;
    }
    uVar6 = ref_node_ghost_int(ref_node,vector,1);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4f3,
             "ref_phys_yplus_metric_reference_length",(ulong)uVar6,"ghost hits");
      return uVar6;
    }
    if (0 < ref_node->max) {
      lVar12 = 0;
      pRVar10 = local_1d0;
      pRVar18 = local_1f8;
      do {
        if ((-1 < ref_node->global[lVar12]) && (iVar17 = vector[lVar12], 0 < iVar17)) {
          lVar9 = 0;
          do {
            pRVar18[lVar9] = pRVar18[lVar9] / (double)iVar17;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
          vector[lVar12] = -1;
          uVar6 = ref_matrix_exp_m(local_1f8 + lVar12 * 6,pRVar10 + lVar12 * 6);
          pRVar10 = local_1d0;
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x4fc,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"form");
            return uVar6;
          }
        }
        lVar12 = lVar12 + 1;
        pRVar18 = pRVar18 + 6;
      } while (lVar12 < ref_node->max);
    }
    uVar6 = ref_edge_create((REF_EDGE *)&local_108,local_1c8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x503,
             "ref_phys_yplus_metric_reference_length",(ulong)uVar6,"orig edges");
      return uVar6;
    }
    ref_edge = (REF_EDGE)CONCAT44(local_108._4_4_,(int)local_108);
    if (0 < ref_edge->n) {
      pRVar3 = ref_edge->e2n;
      lVar12 = 0;
      do {
        iVar17 = pRVar3[lVar12 * 2];
        lVar9 = (long)iVar17;
        iVar1 = pRVar3[lVar12 * 2 + 1];
        iVar2 = vector[lVar9];
        if ((-1 < iVar2) && (vector[iVar1] == -1)) {
          lVar16 = 0;
          do {
            local_1f8[lVar9 * 6 + lVar16] =
                 local_1f8[iVar1 * 6 + lVar16] + local_1f8[lVar9 * 6 + lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          vector[lVar9] = iVar2 + 1;
        }
        iVar2 = vector[iVar1];
        if ((-1 < iVar2) && (vector[lVar9] == -1)) {
          lVar9 = 0;
          do {
            local_1f8[iVar1 * 6 + lVar9] =
                 local_1f8[iVar17 * 6 + lVar9] + local_1f8[iVar1 * 6 + lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
          vector[iVar1] = iVar2 + 1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < ref_edge->n);
    }
    ref_edge_free(ref_edge);
    pRVar10 = local_1d0;
    uVar6 = ref_node_ghost_dbl(ref_node,local_1f8,6);
    if (uVar6 == 0) {
      uVar6 = ref_node_ghost_int(ref_node,vector,1);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x518,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"ghost hits");
        return uVar6;
      }
      if (0 < ref_node->max) {
        lVar12 = 0;
        pRVar18 = local_1f8;
        do {
          if ((-1 < ref_node->global[lVar12]) && (iVar17 = vector[lVar12], 0 < iVar17)) {
            lVar9 = 0;
            do {
              pRVar18[lVar9] = pRVar18[lVar9] / (double)iVar17;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 6);
            vector[lVar12] = -2;
            uVar6 = ref_matrix_exp_m(local_1f8 + lVar12 * 6,pRVar10 + lVar12 * 6);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x521,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"form");
              return uVar6;
            }
          }
          lVar12 = lVar12 + 1;
          pRVar18 = pRVar18 + 6;
        } while (lVar12 < ref_node->max);
      }
      uVar6 = ref_node_ghost_dbl(ref_node,pRVar10,6);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x525,"ref_phys_yplus_metric_reference_length",(ulong)uVar6,"ghost metric");
        return uVar6;
      }
      if (local_1e8 != (REF_DBL *)0x0) {
        free(local_1e8);
      }
      if (local_1f8 != (REF_DBL *)0x0) {
        free(local_1f8);
      }
      if (vector == (REF_INT *)0x0) {
        return 0;
      }
      free(vector);
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x517,
           "ref_phys_yplus_metric_reference_length",(ulong)uVar6,"ghost metric");
    return uVar6;
  }
  pcVar15 = "implement 3D";
  local_1fc = 6;
  uVar11 = 0x4ef;
  uVar14 = 6;
LAB_001b2f20:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar11,
         "ref_phys_yplus_metric_reference_length",uVar14,pcVar15);
  return local_1fc;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric_reference_length(
    REF_GRID ref_grid, REF_DBL *metric, REF_DBL mach, REF_DBL re,
    REF_DBL temperature, REF_DBL target, REF_DBL reference_length, REF_INT ldim,
    REF_DBL *field, REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  REF_DBL reynolds_number, reference_lengthscale, yplus1;
  REF_DBL equilateral_altitude =
      0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */

  reynolds_number = re * reference_length;
  RSS(ref_phys_minspac(reynolds_number, &yplus1), "minspac");
  reference_lengthscale = yplus1 / reference_length;

  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], h, mh, l0, diff, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;

      l0 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);

      diff = ABS(l0 - reference_lengthscale) / reference_lengthscale;

      h0 = target * MIN(l0, reference_lengthscale) / equilateral_altitude;
      {
        REF_DBL st, sr;
        sr = MIN(MAX(diff - 0.1, 0.0) / 0.1, 1.0);
        st = 1.0 - sr;
        h = st * h0 + sr * mh;
        /*
        printf("x %.2f l0 %0.5e ref %0.5e diff %.2f sr %.2f st %.2f\n",
               ref_node_xyz(ref_node, 0, edg_nodes[0]), l0,
               reference_lengthscale, diff, sr, st);
        */
      }
      ref_matrix_eig(d, 0) = 1.0 / (h * h);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}